

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O3

void __thiscall
Test_Template_StringGetTemplate::Test_Template_StringGetTemplate
          (Test_Template_StringGetTemplate *this)

{
  _func_void *local_8;
  
  local_8 = Run;
  if (g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<void(*)(),std::allocator<void(*)()>>::_M_realloc_insert<void(*)()>
              ((vector<void(*)(),std::allocator<void(*)()>> *)&g_testlist,
               (iterator)
               g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_8);
  }
  else {
    *g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
     super__Vector_impl_data._M_finish = Run;
    g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
    super__Vector_impl_data._M_finish =
         g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  return;
}

Assistant:

TEST(Template, StringGetTemplate) {
  TemplateDictionary dict("dict");

  // Test cache lookups
  const char* const tpltext = "{This is perfectly valid} yay!";
  ASSERT(Template::StringToTemplateCache("tgt", tpltext));

  Template* tpl1 = Template::GetTemplate("tgt", DO_NOT_STRIP);
  Template* tpl2 = Template::GetTemplate("tgt", STRIP_WHITESPACE);
  ASSERT(tpl1 && tpl2);
  ASSERT(tpl1 != tpl2);
  AssertExpandIs(tpl1, &dict, tpltext, true);
  AssertExpandIs(tpl2, &dict, tpltext, true);

  // If we register a new string under the same text, it should be
  // ignored.
  ASSERT(!Template::StringToTemplateCache("tgt", tpltext));
  ASSERT(!Template::StringToTemplateCache("tgt", "new text"));
  Template* tpl3 = Template::GetTemplate("tgt", DO_NOT_STRIP);
  ASSERT(tpl3 == tpl1);
  AssertExpandIs(tpl3, &dict, tpltext, true);

  // Tests that syntax errors cause us to return NULL
  ASSERT(!Template::StringToTemplateCache("tgt2", "{{This has spaces}}"));
  ASSERT(!Template::StringToTemplateCache("tgt3", "{{#SEC}}foo"));
  ASSERT(!Template::StringToTemplateCache("tgt4", "{{#S1}}foo{{/S2}}"));
  ASSERT(!Template::StringToTemplateCache("tgt5",
                                          "{{#S1}}foo{{#S2}}bar{{/S1}{{/S2}"));
  ASSERT(!Template::StringToTemplateCache("tgt6", "{{noend"));
  // And that we didn't cache them by mistake
  ASSERT(!Template::GetTemplate("tgt2", STRIP_WHITESPACE));

  Template::ClearCache();
}